

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O2

int read_ADR(coda_cdf_product *product_file,int64_t offset)

{
  long lVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [11];
  undefined1 auVar43 [15];
  undefined1 auVar44 [11];
  undefined1 auVar45 [15];
  undefined1 auVar46 [11];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  int iVar53;
  char *pcVar54;
  ulong uVar55;
  undefined1 auVar56 [16];
  ulong offset_00;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  int local_15c;
  int local_158;
  undefined4 local_154;
  int32_t local_150;
  int local_14c;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  undefined1 local_130 [4];
  undefined1 local_12c [4];
  char name [257];
  
  if (offset == 0) {
    return 0;
  }
  iVar53 = read_bytes(product_file->raw_product,offset + 8,4,&local_14c);
  if (iVar53 < 0) {
    return -1;
  }
  auVar56 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  local_14c >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_14c >> 0x10),local_14c
                                                          )) >> 0x20),local_14c) >> 0x18),
                                      (char)((uint)local_14c >> 8)),(ushort)(byte)local_14c) &
                    0xffffff00ffffff);
  auVar56 = pshuflw(auVar56,auVar56,0x1b);
  sVar9 = auVar56._0_2_;
  sVar10 = auVar56._2_2_;
  sVar11 = auVar56._4_2_;
  sVar12 = auVar56._6_2_;
  local_14c = CONCAT13((0 < sVar12) * (sVar12 < 0x100) * auVar56[6] - (0xff < sVar12),
                       CONCAT12((0 < sVar11) * (sVar11 < 0x100) * auVar56[4] - (0xff < sVar11),
                                CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar56[2] -
                                         (0xff < sVar10),
                                         (0 < sVar9) * (sVar9 < 0x100) * auVar56[0] - (0xff < sVar9)
                                        )));
  if (local_14c == 4) {
    iVar53 = read_bytes(product_file->raw_product,offset + 0xc,8,&local_138);
    if (iVar53 < 0) {
      return -1;
    }
    iVar53 = read_bytes(product_file->raw_product,offset + 0x14,8,&local_140);
    if (iVar53 < 0) {
      return -1;
    }
    iVar53 = read_bytes(product_file->raw_product,offset + 0x1c,4,&local_150);
    if (iVar53 < 0) {
      return -1;
    }
    iVar53 = read_bytes(product_file->raw_product,offset + 0x20,4,&local_154);
    if (iVar53 < 0) {
      return -1;
    }
    iVar53 = read_bytes(product_file->raw_product,offset + 0x24,4,&local_158);
    if (iVar53 < 0) {
      return -1;
    }
    iVar53 = read_bytes(product_file->raw_product,offset + 0x28,4,local_12c);
    if (iVar53 < 0) {
      return -1;
    }
    iVar53 = read_bytes(product_file->raw_product,offset + 0x30,8,&local_148);
    if (iVar53 < 0) {
      return -1;
    }
    iVar53 = read_bytes(product_file->raw_product,offset + 0x38,4,&local_15c);
    if (iVar53 < 0) {
      return -1;
    }
    iVar53 = read_bytes(product_file->raw_product,offset + 0x3c,4,local_130);
    if (iVar53 < 0) {
      return -1;
    }
    iVar53 = read_bytes(product_file->raw_product,offset + 0x44,0x100,name);
    if (iVar53 < 0) {
      return -1;
    }
    name[0x100] = '\0';
    rtrim(name);
    auVar17._8_6_ = 0;
    auVar17._0_8_ = local_138;
    auVar17[0xe] = (char)(local_138 >> 0x38);
    auVar20._8_4_ = 0;
    auVar20._0_8_ = local_138;
    auVar20[0xc] = (char)(local_138 >> 0x30);
    auVar20._13_2_ = auVar17._13_2_;
    auVar23._8_4_ = 0;
    auVar23._0_8_ = local_138;
    auVar23._12_3_ = auVar20._12_3_;
    auVar26._8_2_ = 0;
    auVar26._0_8_ = local_138;
    auVar26[10] = (char)(local_138 >> 0x28);
    auVar26._11_4_ = auVar23._11_4_;
    auVar29._8_2_ = 0;
    auVar29._0_8_ = local_138;
    auVar29._10_5_ = auVar26._10_5_;
    auVar32[8] = (char)(local_138 >> 0x20);
    auVar32._0_8_ = local_138;
    auVar32._9_6_ = auVar29._9_6_;
    auVar56[7] = 0;
    auVar56._0_7_ = auVar32._8_7_;
    auVar41._7_8_ = 0;
    auVar41._0_7_ = auVar32._8_7_;
    auVar47._1_8_ = SUB158(auVar41 << 0x40,7);
    auVar47[0] = (char)(local_138 >> 0x18);
    auVar47._9_6_ = 0;
    auVar42._1_10_ = SUB1510(auVar47 << 0x30,5);
    auVar42[0] = (char)(local_138 >> 0x10);
    auVar48._11_4_ = 0;
    auVar48._0_11_ = auVar42;
    auVar35[2] = (char)(local_138 >> 8);
    auVar35._0_2_ = (ushort)local_138;
    auVar35._3_12_ = SUB1512(auVar48 << 0x20,3);
    auVar38._2_13_ = auVar35._2_13_;
    auVar38._0_2_ = (ushort)local_138 & 0xff;
    auVar56._8_4_ = auVar38._0_4_;
    auVar56._12_4_ = auVar42._0_4_;
    auVar56 = pshuflw(auVar56,auVar56,0x1b);
    auVar56 = pshufhw(auVar56,auVar56,0x1b);
    sVar9 = auVar56._0_2_;
    sVar10 = auVar56._2_2_;
    sVar11 = auVar56._4_2_;
    sVar12 = auVar56._6_2_;
    sVar13 = auVar56._8_2_;
    sVar14 = auVar56._10_2_;
    sVar15 = auVar56._12_2_;
    sVar16 = auVar56._14_2_;
    cVar2 = (0 < sVar16) * (sVar16 < 0x100) * auVar56[0xe] - (0xff < sVar16);
    offset_00 = CONCAT17(cVar2,CONCAT16((0 < sVar15) * (sVar15 < 0x100) * auVar56[0xc] -
                                        (0xff < sVar15),
                                        CONCAT15((0 < sVar14) * (sVar14 < 0x100) * auVar56[10] -
                                                 (0xff < sVar14),
                                                 CONCAT14((0 < sVar13) * (sVar13 < 0x100) *
                                                          auVar56[8] - (0xff < sVar13),
                                                          CONCAT13((0 < sVar12) * (sVar12 < 0x100) *
                                                                   auVar56[6] - (0xff < sVar12),
                                                                   CONCAT12((0 < sVar11) *
                                                                            (sVar11 < 0x100) *
                                                                            auVar56[4] -
                                                                            (0xff < sVar11),
                                                                            CONCAT11((0 < sVar10) *
                                                                                     (sVar10 < 0x100
                                                                                     ) * auVar56[2]
                                                                                     - (0xff < 
                                                  sVar10),(0 < sVar9) * (sVar9 < 0x100) * auVar56[0]
                                                          - (0xff < sVar9))))))));
    auVar18._8_6_ = 0;
    auVar18._0_8_ = local_140;
    auVar18[0xe] = (char)(local_140 >> 0x38);
    auVar21._8_4_ = 0;
    auVar21._0_8_ = local_140;
    auVar21[0xc] = (char)(local_140 >> 0x30);
    auVar21._13_2_ = auVar18._13_2_;
    auVar24._8_4_ = 0;
    auVar24._0_8_ = local_140;
    auVar24._12_3_ = auVar21._12_3_;
    auVar27._8_2_ = 0;
    auVar27._0_8_ = local_140;
    auVar27[10] = (char)(local_140 >> 0x28);
    auVar27._11_4_ = auVar24._11_4_;
    auVar30._8_2_ = 0;
    auVar30._0_8_ = local_140;
    auVar30._10_5_ = auVar27._10_5_;
    auVar33[8] = (char)(local_140 >> 0x20);
    auVar33._0_8_ = local_140;
    auVar33._9_6_ = auVar30._9_6_;
    auVar57[7] = 0;
    auVar57._0_7_ = auVar33._8_7_;
    auVar43._7_8_ = 0;
    auVar43._0_7_ = auVar33._8_7_;
    auVar49._1_8_ = SUB158(auVar43 << 0x40,7);
    auVar49[0] = (char)(local_140 >> 0x18);
    auVar49._9_6_ = 0;
    auVar44._1_10_ = SUB1510(auVar49 << 0x30,5);
    auVar44[0] = (char)(local_140 >> 0x10);
    auVar50._11_4_ = 0;
    auVar50._0_11_ = auVar44;
    auVar36[2] = (char)(local_140 >> 8);
    auVar36._0_2_ = (ushort)local_140;
    auVar36._3_12_ = SUB1512(auVar50 << 0x20,3);
    auVar39._2_13_ = auVar36._2_13_;
    auVar39._0_2_ = (ushort)local_140 & 0xff;
    auVar57._8_4_ = auVar39._0_4_;
    auVar57._12_4_ = auVar44._0_4_;
    auVar56 = pshuflw(auVar57,auVar57,0x1b);
    auVar56 = pshufhw(auVar56,auVar56,0x1b);
    sVar9 = auVar56._0_2_;
    sVar10 = auVar56._2_2_;
    sVar11 = auVar56._4_2_;
    sVar12 = auVar56._6_2_;
    sVar13 = auVar56._8_2_;
    sVar14 = auVar56._10_2_;
    sVar15 = auVar56._12_2_;
    sVar16 = auVar56._14_2_;
    cVar3 = (0 < sVar16) * (sVar16 < 0x100) * auVar56[0xe] - (0xff < sVar16);
    local_140 = CONCAT17(cVar3,CONCAT16((0 < sVar15) * (sVar15 < 0x100) * auVar56[0xc] -
                                        (0xff < sVar15),
                                        CONCAT15((0 < sVar14) * (sVar14 < 0x100) * auVar56[10] -
                                                 (0xff < sVar14),
                                                 CONCAT14((0 < sVar13) * (sVar13 < 0x100) *
                                                          auVar56[8] - (0xff < sVar13),
                                                          CONCAT13((0 < sVar12) * (sVar12 < 0x100) *
                                                                   auVar56[6] - (0xff < sVar12),
                                                                   CONCAT12((0 < sVar11) *
                                                                            (sVar11 < 0x100) *
                                                                            auVar56[4] -
                                                                            (0xff < sVar11),
                                                                            CONCAT11((0 < sVar10) *
                                                                                     (sVar10 < 0x100
                                                                                     ) * auVar56[2]
                                                                                     - (0xff < 
                                                  sVar10),(0 < sVar9) * (sVar9 < 0x100) * auVar56[0]
                                                          - (0xff < sVar9))))))));
    auVar58._8_8_ = 0;
    auVar58._0_8_ =
         (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint
                                                  )local_150 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_150 >> 0x10),local_150
                                                          )) >> 0x20),local_150) >> 0x18),
                                         CONCAT12((char)((uint)local_150 >> 8),(short)local_150)) >>
                               0x10),(short)local_150) & 0xffff00ff00ff00ff;
    auVar56 = pshuflw(auVar58,auVar58,0x1b);
    sVar9 = auVar56._0_2_;
    bVar4 = (0 < sVar9) * (sVar9 < 0x100) * auVar56[0] - (0xff < sVar9);
    sVar9 = auVar56._2_2_;
    sVar10 = auVar56._4_2_;
    sVar11 = auVar56._6_2_;
    local_150 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * auVar56[6] - (0xff < sVar11),
                         CONCAT12((0 < sVar10) * (sVar10 < 0x100) * auVar56[4] - (0xff < sVar10),
                                  CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar56[2] -
                                           (0xff < sVar9),bVar4)));
    auVar59._8_8_ = 0;
    auVar59._0_8_ =
         (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint
                                                  )local_154 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_154 >> 0x10),local_154
                                                          )) >> 0x20),local_154) >> 0x18),
                                         CONCAT12((char)((uint)local_154 >> 8),(short)local_154)) >>
                               0x10),(short)local_154) & 0xffff00ff00ff00ff;
    auVar56 = pshuflw(auVar59,auVar59,0x1b);
    sVar9 = auVar56._0_2_;
    sVar10 = auVar56._2_2_;
    sVar11 = auVar56._4_2_;
    sVar12 = auVar56._6_2_;
    cVar5 = (0 < sVar12) * (sVar12 < 0x100) * auVar56[6] - (0xff < sVar12);
    local_154 = CONCAT13(cVar5,CONCAT12((0 < sVar11) * (sVar11 < 0x100) * auVar56[4] -
                                        (0xff < sVar11),
                                        CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar56[2] -
                                                 (0xff < sVar10),
                                                 (0 < sVar9) * (sVar9 < 0x100) * auVar56[0] -
                                                 (0xff < sVar9))));
    auVar60._8_8_ = 0;
    auVar60._0_8_ =
         (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint
                                                  )local_158 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_158 >> 0x10),local_158
                                                          )) >> 0x20),local_158) >> 0x18),
                                         CONCAT12((char)((uint)local_158 >> 8),(short)local_158)) >>
                               0x10),(short)local_158) & 0xffff00ff00ff00ff;
    auVar56 = pshuflw(auVar60,auVar60,0x1b);
    sVar9 = auVar56._0_2_;
    sVar10 = auVar56._2_2_;
    sVar11 = auVar56._4_2_;
    sVar12 = auVar56._6_2_;
    cVar6 = (0 < sVar12) * (sVar12 < 0x100) * auVar56[6] - (0xff < sVar12);
    local_158 = CONCAT13(cVar6,CONCAT12((0 < sVar11) * (sVar11 < 0x100) * auVar56[4] -
                                        (0xff < sVar11),
                                        CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar56[2] -
                                                 (0xff < sVar10),
                                                 (0 < sVar9) * (sVar9 < 0x100) * auVar56[0] -
                                                 (0xff < sVar9))));
    auVar19._8_6_ = 0;
    auVar19._0_8_ = local_148;
    auVar19[0xe] = (char)(local_148 >> 0x38);
    auVar22._8_4_ = 0;
    auVar22._0_8_ = local_148;
    auVar22[0xc] = (char)(local_148 >> 0x30);
    auVar22._13_2_ = auVar19._13_2_;
    auVar25._8_4_ = 0;
    auVar25._0_8_ = local_148;
    auVar25._12_3_ = auVar22._12_3_;
    auVar28._8_2_ = 0;
    auVar28._0_8_ = local_148;
    auVar28[10] = (char)(local_148 >> 0x28);
    auVar28._11_4_ = auVar25._11_4_;
    auVar31._8_2_ = 0;
    auVar31._0_8_ = local_148;
    auVar31._10_5_ = auVar28._10_5_;
    auVar34[8] = (char)(local_148 >> 0x20);
    auVar34._0_8_ = local_148;
    auVar34._9_6_ = auVar31._9_6_;
    auVar61[7] = 0;
    auVar61._0_7_ = auVar34._8_7_;
    auVar45._7_8_ = 0;
    auVar45._0_7_ = auVar34._8_7_;
    auVar51._1_8_ = SUB158(auVar45 << 0x40,7);
    auVar51[0] = (char)(local_148 >> 0x18);
    auVar51._9_6_ = 0;
    auVar46._1_10_ = SUB1510(auVar51 << 0x30,5);
    auVar46[0] = (char)(local_148 >> 0x10);
    auVar52._11_4_ = 0;
    auVar52._0_11_ = auVar46;
    auVar37[2] = (char)(local_148 >> 8);
    auVar37._0_2_ = (ushort)local_148;
    auVar37._3_12_ = SUB1512(auVar52 << 0x20,3);
    auVar40._2_13_ = auVar37._2_13_;
    auVar40._0_2_ = (ushort)local_148 & 0xff;
    auVar61._8_4_ = auVar40._0_4_;
    auVar61._12_4_ = auVar46._0_4_;
    auVar56 = pshuflw(auVar61,auVar61,0x1b);
    auVar56 = pshufhw(auVar56,auVar56,0x1b);
    sVar9 = auVar56._0_2_;
    sVar10 = auVar56._2_2_;
    sVar11 = auVar56._4_2_;
    sVar12 = auVar56._6_2_;
    sVar13 = auVar56._8_2_;
    sVar14 = auVar56._10_2_;
    sVar15 = auVar56._12_2_;
    sVar16 = auVar56._14_2_;
    cVar7 = (0 < sVar16) * (sVar16 < 0x100) * auVar56[0xe] - (0xff < sVar16);
    local_148 = CONCAT17(cVar7,CONCAT16((0 < sVar15) * (sVar15 < 0x100) * auVar56[0xc] -
                                        (0xff < sVar15),
                                        CONCAT15((0 < sVar14) * (sVar14 < 0x100) * auVar56[10] -
                                                 (0xff < sVar14),
                                                 CONCAT14((0 < sVar13) * (sVar13 < 0x100) *
                                                          auVar56[8] - (0xff < sVar13),
                                                          CONCAT13((0 < sVar12) * (sVar12 < 0x100) *
                                                                   auVar56[6] - (0xff < sVar12),
                                                                   CONCAT12((0 < sVar11) *
                                                                            (sVar11 < 0x100) *
                                                                            auVar56[4] -
                                                                            (0xff < sVar11),
                                                                            CONCAT11((0 < sVar10) *
                                                                                     (sVar10 < 0x100
                                                                                     ) * auVar56[2]
                                                                                     - (0xff < 
                                                  sVar10),(0 < sVar9) * (sVar9 < 0x100) * auVar56[0]
                                                          - (0xff < sVar9))))))));
    auVar62._8_8_ = 0;
    auVar62._0_8_ =
         (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint
                                                  )local_15c >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_15c >> 0x10),local_15c
                                                          )) >> 0x20),local_15c) >> 0x18),
                                         CONCAT12((char)((uint)local_15c >> 8),(short)local_15c)) >>
                               0x10),(short)local_15c) & 0xffff00ff00ff00ff;
    auVar56 = pshuflw((undefined1  [16])0x0,auVar62,0x1b);
    sVar9 = auVar56._0_2_;
    sVar10 = auVar56._2_2_;
    sVar11 = auVar56._4_2_;
    sVar12 = auVar56._6_2_;
    cVar8 = (0 < sVar12) * (sVar12 < 0x100) * auVar56[6] - (0xff < sVar12);
    local_15c = CONCAT13(cVar8,CONCAT12((0 < sVar11) * (sVar11 < 0x100) * auVar56[4] -
                                        (0xff < sVar11),
                                        CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar56[2] -
                                                 (0xff < sVar10),
                                                 (0 < sVar9) * (sVar9 < 0x100) * auVar56[0] -
                                                 (0xff < sVar9))));
    local_138 = offset_00;
    if ((cVar2 < '\0') || (lVar1 = product_file->file_size, lVar1 <= (long)offset_00)) {
      pcVar54 = "CDF file has invalid offset for ADR record";
    }
    else if (cVar3 < '\0' || lVar1 <= (long)local_140) {
      pcVar54 = "CDF file has invalid offset for AgrEDR record";
    }
    else if (cVar5 < '\0') {
      pcVar54 = "CDF file has invalid attribute number in ADR record";
    }
    else if (cVar6 < '\0') {
      pcVar54 = "CDF file has invalid number of g/rEntries in ADR record";
    }
    else if (cVar7 < '\0' || lVar1 <= (long)local_148) {
      pcVar54 = "CDF file has invalid offset for AzEDR record";
    }
    else {
      if (-1 < cVar8) {
        uVar55 = local_140;
        if ((bVar4 & 1) == 0) {
          if (local_158 == 0) {
            uVar55 = local_148;
          }
LAB_0014fb46:
          iVar53 = read_AEDR(product_file,uVar55,name,local_150);
          if (iVar53 != 0) {
            return -1;
          }
          iVar53 = read_ADR(product_file,offset_00);
          return -(uint)(iVar53 != 0);
        }
        if (local_15c == 0) goto LAB_0014fb46;
        pcVar54 = "gADR record has non-zero NzEntries (%d)";
        goto LAB_0014fadc;
      }
      pcVar54 = "CDF file has invalid number of zEntries in ADR record";
    }
    coda_set_error(-300,pcVar54);
  }
  else {
    pcVar54 = "CDF file has invalid record type (%d) for ADR record";
LAB_0014fadc:
    coda_set_error(-300,pcVar54);
  }
  return -1;
}

Assistant:

static int read_ADR(coda_cdf_product *product_file, int64_t offset)
{
    int32_t record_type;
    int64_t adr_next;
    int64_t agredr_head;
    int32_t scope;
    int32_t num;
    int32_t ngr_entries;
    int32_t maxgr_entry;
    int64_t azedr_head;
    int32_t nz_entries;
    int32_t maxz_entry;
    int64_t aedr_head;
    char name[257];

    if (offset == 0)
    {
        return 0;
    }

    if (read_bytes(product_file->raw_product, offset + 8, 4, &record_type) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&record_type);
#endif
    if (record_type != 4)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid record type (%d) for ADR record", record_type);
        return -1;
    }

    if (read_bytes(product_file->raw_product, offset + 12, 8, &adr_next) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 20, 8, &agredr_head) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 28, 4, &scope) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 32, 4, &num) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 36, 4, &ngr_entries) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 40, 4, &maxgr_entry) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 48, 8, &azedr_head) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 56, 4, &nz_entries) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 60, 4, &maxz_entry) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 68, 256, name) < 0)
    {
        return -1;
    }
    name[256] = '\0';
    rtrim(name);
#ifndef WORDS_BIGENDIAN
    swap_int64(&adr_next);
    swap_int64(&agredr_head);
    swap_int32(&scope);
    swap_int32(&num);
    swap_int32(&ngr_entries);
    swap_int32(&maxgr_entry);
    swap_int64(&azedr_head);
    swap_int32(&nz_entries);
    swap_int32(&maxz_entry);
#endif
    if (adr_next < 0 || adr_next >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for ADR record");
        return -1;
    }
    if (agredr_head < 0 || agredr_head >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for AgrEDR record");
        return -1;
    }
    if (num < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid attribute number in ADR record");
        return -1;
    }
    if (ngr_entries < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid number of g/rEntries in ADR record");
        return -1;
    }
    if (azedr_head < 0 || azedr_head >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for AzEDR record");
        return -1;
    }
    if (nz_entries < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid number of zEntries in ADR record");
        return -1;
    }

    aedr_head = agredr_head;
    if (scope & 1)
    {
        if (nz_entries != 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "gADR record has non-zero NzEntries (%d)", nz_entries);
            return -1;
        }
    }
    else if (ngr_entries == 0)
    {
        aedr_head = azedr_head;
    }

    if (read_AEDR(product_file, aedr_head, name, scope) != 0)
    {
        return -1;
    }

    if (read_ADR(product_file, adr_next) != 0)
    {
        return -1;
    }

    return 0;
}